

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

bool __thiscall
libcellml::Variable::VariableImpl::hasIndirectEquivalentVariable
          (VariableImpl *this,VariablePtr *equivalentVariable)

{
  Variable *variable1;
  element_type *peVar1;
  element_type *peVar2;
  undefined1 local_38 [8];
  vector<const_libcellml::Variable_*,_std::allocator<const_libcellml::Variable_*>_> testedVariables;
  VariablePtr *equivalentVariable_local;
  VariableImpl *this_local;
  
  peVar2 = this->mVariable;
  testedVariables.
  super__Vector_base<const_libcellml::Variable_*,_std::allocator<const_libcellml::Variable_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)equivalentVariable;
  peVar1 = std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::get
                     (&equivalentVariable->
                       super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
  if (peVar2 == peVar1) {
    this_local._7_1_ = false;
  }
  else {
    std::vector<const_libcellml::Variable_*,_std::allocator<const_libcellml::Variable_*>_>::vector
              ((vector<const_libcellml::Variable_*,_std::allocator<const_libcellml::Variable_*>_> *)
               local_38);
    variable1 = this->mVariable;
    peVar2 = std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)
                        testedVariables.
                        super__Vector_base<const_libcellml::Variable_*,_std::allocator<const_libcellml::Variable_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local._7_1_ =
         haveEquivalentVariables
                   (variable1,peVar2,
                    (vector<const_libcellml::Variable_*,_std::allocator<const_libcellml::Variable_*>_>
                     *)local_38);
    std::vector<const_libcellml::Variable_*,_std::allocator<const_libcellml::Variable_*>_>::~vector
              ((vector<const_libcellml::Variable_*,_std::allocator<const_libcellml::Variable_*>_> *)
               local_38);
  }
  return this_local._7_1_;
}

Assistant:

bool Variable::VariableImpl::hasIndirectEquivalentVariable(const VariablePtr &equivalentVariable) const
{
    if (mVariable == equivalentVariable.get()) {
        return false;
    }

    std::vector<const Variable *> testedVariables;

    return haveEquivalentVariables(mVariable, equivalentVariable.get(), testedVariables);
}